

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_uqadd_vec(TCGContext_conflict1 *tcg_ctx,uint vece,TCGv_vec t,TCGv_vec sat,TCGv_vec a,
                  TCGv_vec b)

{
  TCGv_vec r;
  uintptr_t o;
  
  r = tcg_temp_new_vec_matching_aarch64(tcg_ctx,t);
  tcg_gen_add_vec_aarch64(tcg_ctx,vece,r,a,b);
  tcg_gen_usadd_vec_aarch64(tcg_ctx,vece,t,a,b);
  tcg_gen_cmp_vec_aarch64(tcg_ctx,TCG_COND_NE,vece,r,r,t);
  tcg_gen_or_vec_aarch64(tcg_ctx,vece,sat,sat,r);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_uqadd_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec t, TCGv_vec sat,
                          TCGv_vec a, TCGv_vec b)
{
    TCGv_vec x = tcg_temp_new_vec_matching(tcg_ctx, t);
    tcg_gen_add_vec(tcg_ctx, vece, x, a, b);
    tcg_gen_usadd_vec(tcg_ctx, vece, t, a, b);
    tcg_gen_cmp_vec(tcg_ctx, TCG_COND_NE, vece, x, x, t);
    tcg_gen_or_vec(tcg_ctx, vece, sat, sat, x);
    tcg_temp_free_vec(tcg_ctx, x);
}